

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O1

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *node)

{
  PSNode **ppPVar1;
  op_iterator pUVar2;
  PSNode *n;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  _Var3;
  Use *arg;
  op_iterator pUVar4;
  
  pUVar4 = (op_iterator)(CI + -(ulong)(uint)(*(int *)(CI + 0x14) << 5));
  pUVar2 = llvm::CallBase::arg_end((CallBase *)CI);
  if (pUVar4 != pUVar2) {
    do {
      n = tryGetOperand(this,*(Value **)pUVar4);
      if (n != (PSNode *)0x0) {
        ppPVar1 = (node->super_SubgraphNode<dg::pta::PSNode>).operands.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<dg::pta::PSNode*const*,std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::SubgraphNode<dg::pta::PSNode>::hasOperand(dg::pta::PSNode*)const::_lambda(dg::pta::PSNode*)_1_>>
                          ((node->super_SubgraphNode<dg::pta::PSNode>).operands.
                           super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,ppPVar1,n);
        if (_Var3._M_current == ppPVar1) {
          SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                    (&node->super_SubgraphNode<dg::pta::PSNode>,n);
        }
      }
      pUVar4 = pUVar4 + 0x20;
    } while (pUVar4 != pUVar2);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst &CI,
                                                  PSNode &node) {
    for (const auto &arg : llvmutils::args(CI)) {
        PSNode *operand = tryGetOperand(arg);
        if (operand && !node.hasOperand(operand)) {
            node.addOperand(operand);
        }
    }
}